

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::from_hex_to_i(string *s,size_t i,size_t cnt,int *val)

{
  pointer pcVar1;
  bool bVar2;
  int v;
  int local_2c;
  
  if (s->_M_string_length <= i) {
    return false;
  }
  *val = 0;
  while( true ) {
    bVar2 = cnt == 0;
    cnt = cnt - 1;
    if (bVar2) {
      return bVar2;
    }
    pcVar1 = (s->_M_dataplus)._M_p;
    if (pcVar1[i] == '\0') break;
    local_2c = 0;
    bVar2 = is_hex(pcVar1[i],&local_2c);
    if (!bVar2) {
      return false;
    }
    *val = *val * 0x10 + local_2c;
    i = i + 1;
  }
  return bVar2;
}

Assistant:

inline bool from_hex_to_i(const std::string &s, size_t i, size_t cnt,
								  int &val) {
			if (i >= s.size()) { return false; }

			val = 0;
			for (; cnt; i++, cnt--) {
				if (!s[i]) { return false; }
				int v = 0;
				if (is_hex(s[i], v)) {
					val = val * 16 + v;
				} else {
					return false;
				}
			}
			return true;
		}